

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSourceArrayLoader.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL::SourceArrayLoader::begin__param
          (SourceArrayLoader *this,param__AttributeData *attributeData)

{
  AccessorParameter accessorParameter;
  value_type local_50;
  
  if (this->mCurrentSoure != (SourceBase *)0x0) {
    local_50.name._M_dataplus._M_p = (pointer)&local_50.name.field_2;
    local_50.name._M_string_length = 0;
    local_50.name.field_2._M_local_buf[0] = '\0';
    local_50.type._M_dataplus._M_p = (pointer)&local_50.type.field_2;
    local_50.type._M_string_length = 0;
    local_50.type.field_2._M_local_buf[0] = '\0';
    if ((attributeData->name != (char *)0x0) && (*attributeData->name != '\0')) {
      std::__cxx11::string::assign((char *)&local_50);
    }
    std::__cxx11::string::assign((char *)&local_50.type);
    std::
    vector<COLLADASaxFWL::SourceBase::AccessorParameter,_std::allocator<COLLADASaxFWL::SourceBase::AccessorParameter>_>
    ::push_back(&this->mCurrentSoure->mAccessor,&local_50);
    SourceBase::AccessorParameter::~AccessorParameter(&local_50);
  }
  return true;
}

Assistant:

bool SourceArrayLoader::begin__param( const param__AttributeData& attributeData )
	{
		if ( mCurrentSoure )
		{
			SourceBase::AccessorParameter accessorParameter;
			if ( attributeData.name && *attributeData.name )
			{
				accessorParameter.name = attributeData.name;
			}

			// the type is required. We don't need to check
			accessorParameter.type = attributeData.type;
			mCurrentSoure->appendAccessorParameter( accessorParameter );
		}
		return true;
	}